

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O3

void leveldb_approximate_sizes
               (leveldb_t *db,int num_ranges,char **range_start_key,size_t *range_start_key_len,
               char **range_limit_key,size_t *range_limit_key_len,uint64_t *sizes)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long lVar5;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < num_ranges) {
    uVar3 = (long)num_ranges * 0x20;
  }
  puVar2 = (undefined8 *)operator_new__(uVar3);
  if (num_ranges != 0) {
    puVar4 = puVar2;
    do {
      *puVar4 = "";
      puVar4[1] = 0;
      puVar4[2] = "";
      puVar4[3] = 0;
      puVar4 = puVar4 + 4;
    } while (puVar4 != puVar2 + (long)num_ranges * 4);
    if (0 < num_ranges) {
      lVar5 = 0;
      do {
        uVar1 = *(undefined8 *)((long)range_start_key_len + lVar5);
        *(undefined8 *)((long)puVar2 + lVar5 * 4) = *(undefined8 *)((long)range_start_key + lVar5);
        *(undefined8 *)((long)puVar2 + lVar5 * 4 + 8) = uVar1;
        uVar1 = *(undefined8 *)((long)range_limit_key_len + lVar5);
        *(undefined8 *)((long)puVar2 + lVar5 * 4 + 0x10) =
             *(undefined8 *)((long)range_limit_key + lVar5);
        *(undefined8 *)((long)puVar2 + lVar5 * 4 + 0x18) = uVar1;
        lVar5 = lVar5 + 8;
      } while ((ulong)(uint)num_ranges << 3 != lVar5);
    }
  }
  (*db->rep->_vptr_DB[10])(db->rep,puVar2,(ulong)(uint)num_ranges,sizes);
  operator_delete__(puVar2);
  return;
}

Assistant:

void leveldb_approximate_sizes(leveldb_t* db, int num_ranges,
                               const char* const* range_start_key,
                               const size_t* range_start_key_len,
                               const char* const* range_limit_key,
                               const size_t* range_limit_key_len,
                               uint64_t* sizes) {
  Range* ranges = new Range[num_ranges];
  for (int i = 0; i < num_ranges; i++) {
    ranges[i].start = Slice(range_start_key[i], range_start_key_len[i]);
    ranges[i].limit = Slice(range_limit_key[i], range_limit_key_len[i]);
  }
  db->rep->GetApproximateSizes(ranges, num_ranges, sizes);
  delete[] ranges;
}